

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IndexedExprLookup(Parse *pParse,Expr *pExpr,int target)

{
  IndexedExpr *pIVar1;
  Vdbe *p;
  int iVar2;
  int iTab;
  IndexedExpr **ppIVar3;
  
  ppIVar3 = &pParse->pIdxExpr;
  while( true ) {
    pIVar1 = *ppIVar3;
    if (pIVar1 == (IndexedExpr *)0x0) {
      return -1;
    }
    iVar2 = pIVar1->iDataCur;
    if ((-1 < iVar2) &&
       (((iTab = iVar2, pParse->iSelfTab == 0 || (iTab = -1, iVar2 == pParse->iSelfTab + -1)) &&
        (iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar1->pExpr,iTab), iVar2 == 0)))) break;
    ppIVar3 = &pIVar1->pIENext;
  }
  p = pParse->pVdbe;
  if (pIVar1->bMaybeNullRow != '\0') {
    iVar2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x14,pIVar1->iIdxCur,iVar2 + 3,target);
    sqlite3VdbeAddOp3(p,0x5e,pIVar1->iIdxCur,pIVar1->iIdxCol,target);
    sqlite3VdbeGoto(p,0);
    pIVar1 = pParse->pIdxExpr;
    pParse->pIdxExpr = (IndexedExpr *)0x0;
    sqlite3ExprCode(pParse,pExpr,target);
    pParse->pIdxExpr = pIVar1;
    sqlite3VdbeJumpHere(p,iVar2 + 2);
    return target;
  }
  sqlite3VdbeAddOp3(p,0x5e,pIVar1->iIdxCur,pIVar1->iIdxCol,target);
  return target;
}

Assistant:

static SQLITE_NOINLINE int sqlite3IndexedExprLookup(
  Parse *pParse,   /* The parsing context */
  Expr *pExpr,     /* The expression to potentially bypass */
  int target       /* Where to store the result of the expression */
){
  IndexedExpr *p;
  Vdbe *v;
  for(p=pParse->pIdxExpr; p; p=p->pIENext){
    int iDataCur = p->iDataCur;
    if( iDataCur<0 ) continue;
    if( pParse->iSelfTab ){
      if( p->iDataCur!=pParse->iSelfTab-1 ) continue;
      iDataCur = -1;
    }
    if( sqlite3ExprCompare(0, pExpr, p->pExpr, iDataCur)!=0 ) continue;
    v = pParse->pVdbe;
    assert( v!=0 );
    if( p->bMaybeNullRow ){
      /* If the index is on a NULL row due to an outer join, then we
      ** cannot extract the value from the index.  The value must be
      ** computed using the original expression. */
      int addr = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_IfNullRow, p->iIdxCur, addr+3, target);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
      sqlite3VdbeGoto(v, 0);
      p = pParse->pIdxExpr;
      pParse->pIdxExpr = 0;
      sqlite3ExprCode(pParse, pExpr, target);
      pParse->pIdxExpr = p;
      sqlite3VdbeJumpHere(v, addr+2);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
    }
    return target;
  }
  return -1;  /* Not found */
}